

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O0

void __thiscall
Fade::run(Fade *this,FadeAggregates *finalAggregates,
         vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
         *aggregateRegister,int *numberOfAggregatesPerNode,int *degreeOfLocalAggregates,
         bool *_onehotfeatures,bool *isDetermined,int *determinedBy)

{
  undefined8 uVar1;
  int iVar2;
  value_type piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  _Rb_tree_const_iterator<double> __last;
  _Rb_tree_const_iterator<double> __last_00;
  _Rb_tree_const_iterator<double> __first;
  _Rb_tree_const_iterator<double> __first_00;
  bool bVar15;
  element_type *peVar16;
  ulong uVar17;
  int *piVar18;
  int **ppiVar19;
  DTreeNode *pDVar20;
  reference pvVar21;
  reference ppiVar22;
  ulong uVar23;
  ulong *puVar24;
  void *pvVar25;
  size_type sVar26;
  ulong *puVar27;
  ostream *poVar28;
  int *in_RCX;
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  *in_RDX;
  undefined8 *in_RSI;
  Fade *in_RDI;
  ulong uVar29;
  int *in_R8;
  bool *in_R9;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __enable_if_t<is_constructible<value_type,_pair<const_double,_set<double>_>_&>::value,_pair<iterator,_bool>_>
  _Var32;
  bool *in_stack_00000008;
  int *in_stack_00000010;
  __enable_if_t<is_constructible<value_type,_pair<const_double,_set<double>_>_&>::value,_pair<iterator,_bool>_>
  insertPair;
  pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_> *p;
  iterator __end5;
  iterator __begin5;
  map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
  *__range5;
  int determinantID;
  size_t i_4;
  uint partition_3;
  int numOfFDs;
  int aggregateNo;
  uint partition_2;
  double *finalContinuousAggregates;
  uint partition_1;
  double numOfTuples;
  int aggregateOffset;
  int numCatAggs;
  size_t table;
  int *upperBounds;
  int *lowerBounds;
  uint partition;
  vector<int_*,_std::allocator<int_*>_> offs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aggs;
  uint fWorker_1;
  uint fWorker;
  Database dataToProcess;
  size_t tableToPartition;
  thread *fWorkers;
  int child;
  int numCatParts;
  int catAggNo;
  int numberOfCatAggregates;
  int numberOfContAggregates;
  int catAggOffset;
  int *childIDs;
  int childCount_1;
  int attID_1;
  int j_3;
  int i_3;
  int i_2;
  int j_2;
  int j_1;
  int i_1;
  int i;
  int j;
  int index;
  int *info;
  int totalNumberOfAggregates;
  int childCount;
  size_t attID;
  int rootID;
  map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
  *in_stack_fffffffffffffcc8;
  ostream *this_00;
  set<double,_std::less<double>,_std::allocator<double>_> *in_stack_fffffffffffffcd0;
  undefined8 *puVar33;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 uVar34;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 uVar35;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  size_type in_stack_fffffffffffffce8;
  double dVar36;
  vector<int_*,_std::allocator<int_*>_> *in_stack_fffffffffffffcf0;
  double dVar37;
  type *in_stack_fffffffffffffcf8;
  thread *in_stack_fffffffffffffd00;
  Fade *in_stack_fffffffffffffd10;
  ulong *puVar38;
  ulong *local_2e8;
  ulong *local_2c0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd70;
  ulong *local_220;
  uint in_stack_fffffffffffffe2c;
  int *in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe39;
  Fade *in_stack_fffffffffffffe40;
  _Self local_1a8;
  _Self local_1a0;
  map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
  *local_198;
  int local_18c;
  ulong local_188;
  uint local_180;
  int local_17c;
  int local_178;
  uint local_174;
  void *local_170;
  uint local_164;
  double local_160;
  int local_158;
  int local_154;
  ulong local_150;
  void *local_148;
  void *local_140;
  uint local_138;
  vector<int_*,_std::allocator<int_*>_> local_130 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_100;
  uint local_e4;
  Database local_d8;
  size_t local_d0;
  uint local_bc;
  Database local_b8;
  size_t local_b0;
  ulong *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int *local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int *local_50;
  int local_48;
  int local_44;
  ulong local_40;
  int local_34;
  bool *local_30;
  int *local_28;
  int *local_20;
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  *local_18;
  undefined8 *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar16 = std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1a0860);
  local_34 = peVar16->_root->_id;
  in_RDI->_numberOfAggregatesPerNode = local_20;
  in_RDI->_degreeOfLocalAggregates = local_28;
  in_RDI->_onehotfeatures = local_30;
  in_RDI->isDetermined = in_stack_00000008;
  in_RDI->determinedBy = in_stack_00000010;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(in_RDI->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 4 + -1]
                       + in_RDI->_numberOfAggregatesPerNode
                         [dfdb::params::NUM_OF_ATTRIBUTES * 3 + -1]);
  uVar17 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  piVar18 = (int *)operator_new__(uVar17);
  in_RDI->_degreeOfCategoricalAggregateGroup = piVar18;
  in_RDI->_numberOfValues = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dfdb::params::NUM_OF_ATTRIBUTES;
  uVar17 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  ppiVar19 = (int **)operator_new__(uVar17);
  in_RDI->_aggregateRegister = ppiVar19;
  for (local_40 = 0; local_40 < dfdb::params::NUM_OF_ATTRIBUTES; local_40 = local_40 + 1) {
    std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a099a);
    pDVar20 = DTree::getNode((DTree *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                             (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    local_44 = pDVar20->_numOfChildren;
    local_48 = in_RDI->_numberOfAggregatesPerNode[local_40] * (local_44 + 2) +
               in_RDI->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 2 + local_40] *
               (local_44 + 3);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)local_48;
    uVar17 = SUB168(auVar6 * ZEXT816(4),0);
    if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    piVar18 = (int *)operator_new__(uVar17);
    in_RDI->_aggregateRegister[local_40] = piVar18;
    local_50 = in_RDI->_aggregateRegister[local_40];
    local_54 = 0;
    for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
      for (local_5c = 0; local_5c < in_RDI->_numberOfAggregatesPerNode[local_40];
          local_5c = local_5c + 1) {
        pvVar21 = std::
                  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                  ::operator[](local_18,local_40);
        ppiVar22 = std::vector<int_*,_std::allocator<int_*>_>::operator[](pvVar21,(long)local_5c);
        local_50[local_54] = (*ppiVar22)[local_58];
        local_54 = local_54 + 1;
      }
    }
    for (local_60 = 0; local_60 < in_RDI->_numberOfAggregatesPerNode[local_40];
        local_60 = local_60 + 1) {
      for (local_64 = 2; local_64 < local_44 + 2; local_64 = local_64 + 1) {
        pvVar21 = std::
                  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                  ::operator[](local_18,local_40);
        ppiVar22 = std::vector<int_*,_std::allocator<int_*>_>::operator[](pvVar21,(long)local_60);
        local_50[local_54] = (*ppiVar22)[local_64];
        local_54 = local_54 + 1;
      }
    }
    for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
      for (local_6c = 0; local_6c < local_20[dfdb::params::NUM_OF_ATTRIBUTES * 2 + local_40];
          local_6c = local_6c + 1) {
        pvVar21 = std::
                  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                  ::operator[](local_18,local_40);
        ppiVar22 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                             (pvVar21,(long)(in_RDI->_numberOfAggregatesPerNode[local_40] + local_6c
                                            ));
        local_50[local_54] = (*ppiVar22)[local_68];
        local_54 = local_54 + 1;
      }
    }
    for (local_70 = 0;
        local_70 <
        in_RDI->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 2 + local_40];
        local_70 = local_70 + 1) {
      for (local_74 = 2; local_74 < local_44 + 3; local_74 = local_74 + 1) {
        pvVar21 = std::
                  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                  ::operator[](local_18,local_40);
        ppiVar22 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                             (pvVar21,(long)(in_RDI->_numberOfAggregatesPerNode[local_40] + local_70
                                            ));
        local_50[local_54] = (*ppiVar22)[local_74];
        local_54 = local_54 + 1;
      }
    }
  }
  local_78 = (int)dfdb::params::NUM_OF_ATTRIBUTES;
  while (local_78 = local_78 + -1, -1 < local_78) {
    std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a0e4f);
    pDVar20 = DTree::getNode((DTree *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                             (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    local_7c = pDVar20->_numOfChildren;
    std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a0e79);
    pDVar20 = DTree::getNode((DTree *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                             (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    local_88 = pDVar20->_childrenIDs;
    local_8c = in_RDI->_numberOfAggregatesPerNode
               [dfdb::params::NUM_OF_ATTRIBUTES * 3 + (long)local_78];
    local_90 = in_RDI->_numberOfAggregatesPerNode[local_78];
    local_94 = in_RDI->_numberOfAggregatesPerNode
               [dfdb::params::NUM_OF_ATTRIBUTES * 2 + (long)local_78];
    for (local_98 = 0; local_98 < local_94; local_98 = local_98 + 1) {
      local_9c = 0;
      for (local_a0 = 0; local_a0 < local_7c; local_a0 = local_a0 + 1) {
        pvVar21 = std::
                  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                  ::operator[](local_18,(long)local_78);
        ppiVar22 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                             (pvVar21,(long)(local_90 + local_98));
        if (in_RDI->_numberOfAggregatesPerNode[local_88[local_a0]] <= (*ppiVar22)[local_a0 + 2]) {
          piVar18 = in_RDI->_degreeOfCategoricalAggregateGroup;
          iVar2 = in_RDI->_numberOfAggregatesPerNode
                  [dfdb::params::NUM_OF_ATTRIBUTES * 3 + (long)local_88[local_a0]];
          pvVar21 = std::
                    vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                    ::operator[](local_18,(long)local_78);
          ppiVar22 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                               (pvVar21,(long)(local_90 + local_98));
          local_9c = piVar18[(iVar2 + (*ppiVar22)[local_a0 + 2]) -
                             in_RDI->_numberOfAggregatesPerNode[local_88[local_a0]]] + local_9c;
        }
      }
      pvVar21 = std::
                vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                ::operator[](local_18,(long)local_78);
      ppiVar22 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                           (pvVar21,(long)(local_90 + local_98));
      if ((*ppiVar22)[local_7c + 2] == 1) {
        local_9c = local_9c + 1;
      }
      in_RDI->_degreeOfCategoricalAggregateGroup[local_8c + local_98] = local_9c;
    }
  }
  if (in_RDI->_numOfThreads < 2) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dfdb::params::NUM_OF_TABLES;
    uVar17 = SUB168(auVar9 * ZEXT816(4),0);
    if (SUB168(auVar9 * ZEXT816(4),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    local_140 = operator_new__(uVar17);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dfdb::params::NUM_OF_TABLES;
    uVar17 = SUB168(auVar10 * ZEXT816(4),0);
    if (SUB168(auVar10 * ZEXT816(4),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    local_148 = operator_new__(uVar17);
    for (local_150 = 0; local_150 < dfdb::params::NUM_OF_TABLES; local_150 = local_150 + 1) {
      *(undefined4 *)((long)local_140 + local_150 * 4) = 0;
      sVar26 = std::vector<double_*,_std::allocator<double_*>_>::size(in_RDI->_data + local_150);
      *(int *)((long)local_148 + local_150 * 4) = (int)sVar26 + -1;
    }
    runAggregator(in_stack_fffffffffffffe40,
                  (int *)CONCAT71(in_stack_fffffffffffffe39,in_stack_fffffffffffffe38),
                  in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    local_154 = in_RDI->_numberOfAggregatesPerNode
                [dfdb::params::NUM_OF_ATTRIBUTES * 2 + (long)local_34];
    if (0 < local_154) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = (long)local_154;
      uVar17 = SUB168(auVar11 * ZEXT816(4),0);
      if (SUB168(auVar11 * ZEXT816(4),8) != 0) {
        uVar17 = 0xffffffffffffffff;
      }
      pvVar25 = operator_new__(uVar17);
      local_10[1] = pvVar25;
      memcpy((void *)local_10[1],
             in_RDI->_aggregatesPerPartition->categoricalOffsets +
             in_RDI->_numberOfAggregatesPerNode
             [dfdb::params::NUM_OF_ATTRIBUTES * 3 + (long)local_34],(long)local_154 << 2);
    }
    if (local_140 != (void *)0x0) {
      operator_delete__(local_140);
    }
    if (local_148 != (void *)0x0) {
      operator_delete__(local_148);
    }
  }
  else {
    uVar17 = CONCAT44(0,in_RDI->_numOfThreads);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar17;
    uVar23 = SUB168(auVar7 * ZEXT816(8),0);
    uVar29 = uVar23 + 8;
    if (SUB168(auVar7 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar23) {
      uVar29 = 0xffffffffffffffff;
    }
    local_a8 = (ulong *)operator_new__(uVar29);
    *local_a8 = uVar17;
    local_a8 = local_a8 + 1;
    if (uVar17 != 0) {
      local_220 = local_a8;
      do {
        std::thread::thread((thread *)0x1a11ff);
        local_220 = local_220 + 1;
      } while (local_220 != local_a8 + uVar17);
    }
    local_b0 = getTableToPartition(in_stack_fffffffffffffd10);
    local_b8 = in_RDI->_data;
    for (local_bc = 0; local_bc < in_RDI->_numOfThreads; local_bc = local_bc + 1) {
      local_d8 = local_b8;
      local_d0 = local_b0;
      std::thread::
      thread<Fade::run(fade::FadeAggregates&,std::vector<std::vector<int*,std::allocator<int*>>,std::allocator<std::vector<int*,std::allocator<int*>>>>&,int*,int*,bool*,bool*,int*)::__0,,void>
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      std::thread::operator=
                ((thread *)in_stack_fffffffffffffcd0,(thread *)in_stack_fffffffffffffcc8);
      std::thread::~thread((thread *)0x1a12f7);
    }
    for (local_e4 = 0; puVar27 = local_a8, local_e4 < in_RDI->_numOfThreads; local_e4 = local_e4 + 1
        ) {
      std::thread::join();
    }
    if (local_a8 != (ulong *)0x0) {
      puVar24 = local_a8 + -1;
      for (puVar38 = local_a8 + local_a8[-1]; puVar27 != puVar38; puVar38 = puVar38 + -1) {
        std::thread::~thread((thread *)0x1a13be);
      }
      operator_delete__(puVar24);
    }
    std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1a1413);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
              ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1a143f);
    std::allocator<int_*>::allocator((allocator<int_*> *)0x1a146a);
    std::vector<int_*,_std::allocator<int_*>_>::vector
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    std::allocator<int_*>::~allocator((allocator<int_*> *)0x1a1496);
    for (local_138 = 0; local_138 < in_RDI->_numOfPartitions; local_138 = local_138 + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_100,(ulong)local_138);
      std::vector<double,_std::allocator<double>_>::operator=
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      piVar3 = in_RDI->_aggregatesPerPartition[local_138].categoricalOffsets;
      ppiVar22 = std::vector<int_*,_std::allocator<int_*>_>::operator[](local_130,(ulong)local_138);
      *ppiVar22 = piVar3;
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)in_RDI->_numberOfAggregatesPerNode
                         [(long)local_34 + dfdb::params::NUM_OF_ATTRIBUTES * 2];
    uVar17 = SUB168(auVar8 * ZEXT816(4),0);
    if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    pvVar25 = operator_new__(uVar17);
    local_10[1] = pvVar25;
    mergeCategoricalValues
              (in_RDI,(vector<double,_std::allocator<double>_> *)(local_10 + 2),(int *)local_10[1],
               &local_100,local_130);
    std::vector<int_*,_std::allocator<int_*>_>::~vector
              ((vector<int_*,_std::allocator<int_*>_> *)
               CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  }
  local_158 = in_RDI->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES + (long)local_34];
  local_160 = 0.0;
  for (local_164 = 0; local_164 < in_RDI->_numOfPartitions; local_164 = local_164 + 1) {
    local_160 = *in_RDI->_aggregatesPerPartition[local_164].aggregates + local_160;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (long)in_RDI->_numberOfAggregatesPerNode[local_34];
  uVar17 = SUB168(auVar12 * ZEXT816(8),0);
  if (SUB168(auVar12 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar25 = operator_new__(uVar17);
  memset(pvVar25,0,uVar17);
  for (local_174 = 0; local_174 < in_RDI->_numOfPartitions; local_174 = local_174 + 1) {
    for (local_178 = 0; local_178 < in_RDI->_numberOfAggregatesPerNode[local_34];
        local_178 = local_178 + 1) {
      *(double *)((long)pvVar25 + (long)local_178 * 8) =
           in_RDI->_aggregatesPerPartition[local_174].aggregates[local_158 + local_178] +
           *(double *)((long)pvVar25 + (long)local_178 * 8);
    }
  }
  *local_10 = pvVar25;
  uVar17 = dfdb::params::NUM_OF_ATTRIBUTES;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dfdb::params::NUM_OF_ATTRIBUTES;
  uVar23 = SUB168(auVar13 * ZEXT816(0x30),0);
  uVar29 = uVar23 + 8;
  if (SUB168(auVar13 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar23) {
    uVar29 = 0xffffffffffffffff;
  }
  local_170 = pvVar25;
  puVar27 = (ulong *)operator_new__(uVar29);
  *puVar27 = uVar17;
  puVar27 = puVar27 + 1;
  if (uVar17 != 0) {
    local_2c0 = puVar27;
    do {
      std::
      map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
      ::map((map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
             *)0x1a1b84);
      local_2c0 = local_2c0 + 6;
    } while (local_2c0 != puVar27 + uVar17 * 6);
  }
  local_10[5] = puVar27;
  local_17c = in_stack_00000010[dfdb::params::NUM_OF_ATTRIBUTES];
  uVar17 = (ulong)local_17c;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar17;
  uVar23 = SUB168(auVar14 * ZEXT816(0x30),0);
  uVar29 = uVar23 + 8;
  if (SUB168(auVar14 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar23) {
    uVar29 = 0xffffffffffffffff;
  }
  puVar27 = (ulong *)operator_new__(uVar29);
  *puVar27 = uVar17;
  puVar27 = puVar27 + 1;
  if (uVar17 != 0) {
    puVar38 = puVar27 + uVar17 * 6;
    local_2e8 = puVar27;
    do {
      std::set<double,_std::less<double>,_std::allocator<double>_>::set
                ((set<double,_std::less<double>,_std::allocator<double>_> *)0x1a1c4a);
      local_2e8 = local_2e8 + 6;
    } while (local_2e8 != puVar38);
  }
  local_10[6] = puVar27;
  if (0 < local_17c) {
    for (local_180 = 0; local_180 < in_RDI->_numOfPartitions; local_180 = local_180 + 1) {
      for (local_188 = 0; local_188 < dfdb::params::NUM_OF_ATTRIBUTES; local_188 = local_188 + 1) {
        if ((in_stack_00000008[local_188] & 1U) != 0) {
          local_18c = in_stack_00000010[local_188];
          local_198 = in_RDI->_aggregatesPerPartition[local_180].functionalDependencies + local_188;
          local_1a0._M_node =
               (_Base_ptr)
               std::
               map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
               ::begin(in_stack_fffffffffffffcc8);
          local_1a8._M_node =
               (_Base_ptr)
               std::
               map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
               ::end(in_stack_fffffffffffffcc8);
          while (bVar15 = std::operator!=(&local_1a0,&local_1a8), bVar15) {
            std::
            _Rb_tree_iterator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
            ::operator*((_Rb_tree_iterator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
                         *)in_stack_fffffffffffffcd0);
            std::set<double,_std::less<double>,_std::allocator<double>_>::begin
                      ((set<double,_std::less<double>,_std::allocator<double>_> *)
                       in_stack_fffffffffffffcc8);
            std::set<double,_std::less<double>,_std::allocator<double>_>::end
                      ((set<double,_std::less<double>,_std::allocator<double>_> *)
                       in_stack_fffffffffffffcc8);
            __first._M_node._4_4_ = in_stack_fffffffffffffce4;
            __first._M_node._0_4_ = in_stack_fffffffffffffce0;
            __last._M_node._4_4_ = in_stack_fffffffffffffcdc;
            __last._M_node._0_4_ = in_stack_fffffffffffffcd8;
            std::set<double,std::less<double>,std::allocator<double>>::
            insert<std::_Rb_tree_const_iterator<double>>(in_stack_fffffffffffffcd0,__first,__last);
            _Var32 = std::
                     map<double,std::set<double,std::less<double>,std::allocator<double>>,std::less<double>,std::allocator<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>>
                     ::
                     insert<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>&>
                               ((map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                (pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
            if (((undefined1  [16])_Var32 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::
              _Rb_tree_iterator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
                            *)0x1a1e80);
              std::set<double,_std::less<double>,_std::allocator<double>_>::begin
                        ((set<double,_std::less<double>,_std::allocator<double>_> *)
                         in_stack_fffffffffffffcc8);
              std::set<double,_std::less<double>,_std::allocator<double>_>::end
                        ((set<double,_std::less<double>,_std::allocator<double>_> *)
                         in_stack_fffffffffffffcc8);
              __first_00._M_node._4_4_ = in_stack_fffffffffffffce4;
              __first_00._M_node._0_4_ = in_stack_fffffffffffffce0;
              __last_00._M_node._4_4_ = in_stack_fffffffffffffcdc;
              __last_00._M_node._0_4_ = in_stack_fffffffffffffcd8;
              std::set<double,std::less<double>,std::allocator<double>>::
              insert<std::_Rb_tree_const_iterator<double>>
                        (in_stack_fffffffffffffcd0,__first_00,__last_00);
            }
            std::
            _Rb_tree_iterator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
            ::operator++((_Rb_tree_iterator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
                          *)in_stack_fffffffffffffcd0);
          }
        }
      }
    }
  }
  this_00 = (ostream *)&std::cout;
  poVar28 = std::operator<<((ostream *)&std::cout,
                            "DATA - Number of values in Factorised Representation: ");
  poVar28 = (ostream *)std::ostream::operator<<(poVar28,in_RDI->_numberOfValues);
  std::operator<<(poVar28,"\n");
  poVar28 = std::operator<<(this_00,"DATA - Number of values in Listing Representation: ");
  puVar33 = &dfdb::params::NUM_OF_ATTRIBUTES;
  uVar34 = 0x43300000;
  uVar35 = 0x45300000;
  auVar30._8_4_ = (int)(dfdb::params::NUM_OF_ATTRIBUTES >> 0x20);
  auVar30._0_8_ = dfdb::params::NUM_OF_ATTRIBUTES;
  auVar30._12_4_ = 0x45300000;
  dVar36 = 4503599627370496.0;
  dVar37 = 1.9342813113834067e+25;
  poVar28 = (ostream *)
            std::ostream::operator<<
                      (poVar28,(long)(*(double *)*local_10 *
                                     ((auVar30._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,
                                                       (int)dfdb::params::NUM_OF_ATTRIBUTES) -
                                     4503599627370496.0))));
  std::ostream::operator<<(poVar28,std::endl<char,std::char_traits<char>>);
  poVar28 = (ostream *)std::ostream::operator<<(this_00,std::fixed);
  poVar28 = std::operator<<(poVar28,"DATA - Compression Factor: ");
  uVar1 = *puVar33;
  auVar31._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar31._0_8_ = uVar1;
  auVar31._12_4_ = uVar35;
  poVar28 = (ostream *)
            std::ostream::operator<<
                      (poVar28,(*(double *)*local_10 *
                               ((auVar31._8_8_ - dVar37) +
                               ((double)CONCAT44(uVar34,(int)uVar1) - dVar36))) /
                               (double)in_RDI->_numberOfValues);
  std::ostream::operator<<(poVar28,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Fade::run(
    FadeAggregates& finalAggregates, std::vector<std::vector<int*> >& aggregateRegister,
    int* numberOfAggregatesPerNode, int* degreeOfLocalAggregates, bool* _onehotfeatures,
    bool* isDetermined, int* determinedBy)
{
    int rootID = _dTree->_root->_id;
    
    _numberOfAggregatesPerNode = numberOfAggregatesPerNode;
    _degreeOfLocalAggregates = degreeOfLocalAggregates;

    this->_onehotfeatures = _onehotfeatures;
    this->isDetermined = isDetermined; 
    this->determinedBy = determinedBy; 

    _degreeOfCategoricalAggregateGroup =
        new int[_numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 4 - 1] +
                _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 - 1]];
    
    _numberOfValues = 0;
    
    /*
     * _aggregateRegister is used as a performance improvement for better
     * accessing of aggregateInfoPerNode
     */
    _aggregateRegister = new int*[NUM_OF_ATTRIBUTES];

    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES; ++attID)
    {
        int childCount = _dTree->getNode(attID)->_numOfChildren;

        int totalNumberOfAggregates =
            _numberOfAggregatesPerNode[attID] * (childCount + 2) +
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID] *
            (childCount + 3);

        _aggregateRegister[attID] = new int[totalNumberOfAggregates];

        int *info = _aggregateRegister[attID];
        int index = 0;

        for (int j = 0; j < 2; ++j)
        {
            for (int i = 0; i < _numberOfAggregatesPerNode[attID]; ++i)
            {
                info[index] = aggregateRegister[attID][i][j];
                ++index;
            }
        }

        for (int i = 0; i < _numberOfAggregatesPerNode[attID]; ++i)
        {
            for (int j = 2; j < childCount + 2; ++j)
            {
                info[index] = aggregateRegister[attID][i][j];
                ++index;
            }
        }

        for (int j = 0; j < 2; ++j)
        {
            for (int i = 0; i <
                     numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID]; ++i)
            {
                info[index] =
                    aggregateRegister[attID][_numberOfAggregatesPerNode[attID] + i][j];
                ++index;
            }
        }

        for (int i = 0; i <
                 _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID]; ++i)
        {
            for (int j = 2; j < childCount + 3; ++j)
            {
                info[index] =
                    aggregateRegister[attID][_numberOfAggregatesPerNode[attID] + i][j];
                ++index;
            }
        }
    }

        
    for (int attID = NUM_OF_ATTRIBUTES - 1; attID >= 0; --attID)
    {
        int childCount = _dTree->getNode(attID)->_numOfChildren;
        int *childIDs = _dTree->getNode(attID)->_childrenIDs;
        int catAggOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID];

        int numberOfContAggregates = _numberOfAggregatesPerNode[attID];
        int numberOfCatAggregates =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES*2 + attID];

        for (int catAggNo = 0; catAggNo < numberOfCatAggregates; ++catAggNo)
        {
            int numCatParts = 0;
            for (int child = 0; child < childCount; ++child)
            {
                if (aggregateRegister[attID][numberOfContAggregates + catAggNo][child + 2] >=
                    _numberOfAggregatesPerNode[childIDs[child]])
                {

                    numCatParts +=
                        _degreeOfCategoricalAggregateGroup[
                            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + childIDs[child]] +
                            aggregateRegister[attID][numberOfContAggregates + catAggNo][child + 2] -
                            _numberOfAggregatesPerNode[childIDs[child]]];
                }
            }

            if (aggregateRegister[attID][numberOfContAggregates + catAggNo][childCount + 2] == 1)
                numCatParts += 1;

            _degreeOfCategoricalAggregateGroup[catAggOffset + catAggNo] = numCatParts;
        }
    }
    
    /* Spawn threads and do partitioning. */
    if (_numOfThreads > 1)
    {
        /* Array containing threads to run F on different partitions. */
        thread* fWorkers = new thread[_numOfThreads];

        /* Table to partition (only one table is partitioned to guarantee join
         * correctness). */
        size_t tableToPartition = getTableToPartition();

        DINFO(
            "INFO - engine: launching " + to_string(_numOfThreads)
            + " threads to process " + to_string(_numOfPartitions)
            + " partitions on table " + to_string(tableToPartition)
            + ".\n");

        /* This is needed for the lambda expression below - does not accept a
         * variable that is out of scope. */
        Database dataToProcess = _data;
        
        /* Launch threads to work on different partitions of the input data. */
        for (unsigned int fWorker = 0; fWorker < _numOfThreads; ++fWorker)
        {
            fWorkers[fWorker] =
                thread(
                    [this, dataToProcess, tableToPartition]()
                    {
                        /* Current partition to work on; increase value for next
                         * thread to fetch. */
                        unsigned int currentPartition =
                        _nextPartition.fetch_add(1, memory_order_relaxed);

                        /* Iterate while not all the partitions were processed. */
                        while (currentPartition < _numOfPartitions)
                        {
                            /* Set bounds for the different tables. */
                            int* lowerBounds = new int[NUM_OF_TABLES];
                            int* upperBounds = new int[NUM_OF_TABLES];
                            for (size_t table = 0; table < NUM_OF_TABLES; ++table)
                            {
                                /* This is not a table to partition; it will be
                                 * fully processed. */
                                if(table != tableToPartition)
                                {
                                    lowerBounds[table] = 0;
                                    upperBounds[table] = _data[table].size() - 1;
                                }
                                /* Table to partition; define bounds based on
                                 * current partition number. */
                                else
                                {
                                    lowerBounds[table] = (int)(_data[table].size() * ((double) currentPartition/_numOfPartitions));
                                    upperBounds[table] = (int)(_data[table].size() * ((double) (currentPartition+1)/_numOfPartitions)) - 1;
                                }

                            }


                            /* Launch Fade to compute Aggregates. */
                            runAggregator(lowerBounds, upperBounds, currentPartition);

                            /* Retrieve and increase value of current partition
                             * to work on. */
                            currentPartition = _nextPartition.fetch_add(1, memory_order_relaxed);

                            /* Clean up bound arrays. */
                            delete[] lowerBounds;
                            delete[] upperBounds;
                        }
                    });
        }

        /* Wait for all threads to finish their tasks. */
        for (unsigned int fWorker = 0; fWorker < _numOfThreads; ++fWorker)
        {
            fWorkers[fWorker].join();
        }

        /* Delete array of threads. */
        delete[] fWorkers;

        vector<vector<double> > aggs(_numOfPartitions);
        vector<int*> offs(_numOfPartitions);
        /* Launch threads to work on different partitions of the input data. */
        for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
        {
            aggs[partition] = _aggregatesPerPartition[partition].categoricalAggregates[rootID];			
            offs[partition] = _aggregatesPerPartition[partition].categoricalOffsets;
        }

        finalAggregates.categoricalOffsets =
            new int[_numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID]];
        
        mergeCategoricalValues(finalAggregates.categoricalAggregates,
                               finalAggregates.categoricalOffsets, aggs, offs);
    }
    else
    {
        /* Set bounds for the different tables: they cover the whole tables */
        int* lowerBounds = new int[NUM_OF_TABLES];
        int* upperBounds = new int[NUM_OF_TABLES];
        for (size_t table = 0; table < NUM_OF_TABLES; ++table)
        {
            lowerBounds[table] = 0;
            upperBounds[table] = _data[table].size() - 1;
        }

        /* Launch Fade to compute Aggregates. */
        runAggregator(lowerBounds, upperBounds, 0);

        /* Retrieving the final categorical aggregates. */
        finalAggregates.categoricalAggregates =
            _aggregatesPerPartition[0].categoricalAggregates[rootID];

        /* Retrieving the final number of categorical aggregate groups. */
        int numCatAggs = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID];

        /* Retrieving the final offsets for each categorical aggregate group. */
        if (numCatAggs > 0)
        {
            finalAggregates.categoricalOffsets = new int[numCatAggs];
            memcpy(finalAggregates.categoricalOffsets,
                   &_aggregatesPerPartition[0].categoricalOffsets[
                       _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + rootID]],
                   sizeof(int) * numCatAggs);
        }

        /* Clean up bound arrays. */
        delete[] lowerBounds;
        delete[] upperBounds;
    }

    int aggregateOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + rootID];

    double numOfTuples = 0.0; 
    for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
    {
        numOfTuples += _aggregatesPerPartition[partition].aggregates[0];
    }

    /* Retrieve the aggregates from all the partitions and sum them up. */
    double* finalContinuousAggregates =
        new double[_numberOfAggregatesPerNode[rootID]]();

    for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
    {
        for (int aggregateNo = 0; aggregateNo <
                 _numberOfAggregatesPerNode[rootID]; ++aggregateNo)
            finalContinuousAggregates[aggregateNo] +=
                _aggregatesPerPartition[partition].aggregates[aggregateOffset + aggregateNo];
    }

    finalAggregates.aggregates = finalContinuousAggregates;


    finalAggregates.functionalDependencies = new map<double, set<double>>[NUM_OF_ATTRIBUTES];

    int numOfFDs = determinedBy[NUM_OF_ATTRIBUTES];
    finalAggregates.determinantValueSet = new set<double>[numOfFDs];

    if(numOfFDs > 0)
    {
        /* We combine the FDs from different partitions & collect the set of determinant values. */
        for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
        {
            for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
            {
                if (isDetermined[i])
                {
                    int determinantID = determinedBy[i];
                    for (auto& p : _aggregatesPerPartition[partition].functionalDependencies[i])
                    {
                        finalAggregates.determinantValueSet[determinedBy[determinantID]].insert(p.second.begin(), p.second.end());

                        auto insertPair = finalAggregates.functionalDependencies[i].insert(p);
                        if (!insertPair.second)
                            insertPair.first->second.insert(p.second.begin(), p.second.end());
                    }
                }
            }
        }
    }

    std::cout << "DATA - Number of values in Factorised Representation: " << _numberOfValues << "\n";
    std::cout << "DATA - Number of values in Listing Representation: " <<
        long(finalAggregates.aggregates[0] * NUM_OF_ATTRIBUTES) << std::endl;
    std::cout << std::fixed << "DATA - Compression Factor: "
              << (finalAggregates.aggregates[0] * NUM_OF_ATTRIBUTES) / _numberOfValues
              << std::endl;   
}